

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O0

void __thiscall VDasher::updateActiveSegment(VDasher *this)

{
  bool bVar1;
  VDasher *in_RDI;
  
  in_RDI->mStartNewSegment = true;
  if ((in_RDI->mDiscard & 1U) == 0) {
    in_RDI->mDiscard = true;
    in_RDI->mCurrentLength = in_RDI->mDashArray[in_RDI->mIndex].gap;
  }
  else {
    in_RDI->mDiscard = false;
    in_RDI->mIndex = (in_RDI->mIndex + 1) % in_RDI->mArraySize;
    in_RDI->mCurrentLength = in_RDI->mDashArray[in_RDI->mIndex].length;
  }
  bVar1 = vIsZero(0.0);
  if (bVar1) {
    updateActiveSegment(in_RDI);
  }
  return;
}

Assistant:

void VDasher::updateActiveSegment()
{
    mStartNewSegment = true;

    if (mDiscard) {
        mDiscard = false;
        mIndex = (mIndex + 1) % mArraySize;
        mCurrentLength = mDashArray[mIndex].length;
    } else {
        mDiscard = true;
        mCurrentLength = mDashArray[mIndex].gap;
    }
    if (vIsZero(mCurrentLength)) updateActiveSegment();
}